

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testGeneratedFileStream.cxx
# Opt level: O3

int testGeneratedFileStream(int param_1,char **param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  _Alloc_hider __s;
  string *psVar5;
  ostream *poVar6;
  string file1tmp;
  string file4tmp;
  string file3tmp;
  string file2tmp;
  string file4;
  string file3;
  string file2;
  string file1;
  cmGeneratedFileStream gm;
  allocator<char> local_3b9;
  string local_3b8;
  string local_398;
  string local_378;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  cmGeneratedFileStream local_298;
  
  cmGeneratedFileStream::cmGeneratedFileStream(&local_298,None);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"generatedFile1","");
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"generatedFile2","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"generatedFile3","");
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"generatedFile4","");
  local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_398,local_2b8._M_dataplus._M_p,
             local_2b8._M_dataplus._M_p + local_2b8._M_string_length);
  std::__cxx11::string::append((char *)&local_398);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_338,local_2d8._M_dataplus._M_p,
             local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
  std::__cxx11::string::append((char *)&local_338);
  local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_358,local_2f8._M_dataplus._M_p,
             local_2f8._M_dataplus._M_p + local_2f8._M_string_length);
  std::__cxx11::string::append((char *)&local_358);
  local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_378,local_318._M_dataplus._M_p,
             local_318._M_dataplus._M_p + local_318._M_string_length);
  psVar5 = &local_378;
  std::__cxx11::string::append((char *)psVar5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,local_2b8._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&local_298,&local_3b8,false,false);
  paVar1 = &local_3b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_298,"This is generated file 1",0x18);
  cmGeneratedFileStream::Close(&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,local_2d8._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&local_298,&local_3b8,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_298,"This is generated file 2",0x18);
  cmGeneratedFileStream::Close(&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,local_2f8._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&local_298,&local_3b8,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_298,"This is generated file 3",0x18);
  cmGeneratedFileStream::Close(&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,local_318._M_dataplus._M_p,&local_3b9);
  cmGeneratedFileStream::Open(&local_298,&local_3b8,false,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_298,"This is generated file 4",0x18);
  cmGeneratedFileStream::Close(&local_298);
  bVar2 = cmsys::SystemTools::FileExists(local_2b8._M_dataplus._M_p);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FileExists(local_2d8._M_dataplus._M_p);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Cannot find file: ",0x3e);
      __s._M_p = local_2d8._M_dataplus._M_p;
      goto LAB_00174773;
    }
    bVar2 = cmsys::SystemTools::FileExists(local_2f8._M_dataplus._M_p);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Something wrong with cmGeneratedFileStream. Found file: ",
                 0x38);
      __s._M_p = local_2f8._M_dataplus._M_p;
      goto LAB_00174773;
    }
    bVar2 = cmsys::SystemTools::FileExists(local_318._M_dataplus._M_p);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Cannot find file: ",0x3e);
      __s._M_p = local_318._M_dataplus._M_p;
      goto LAB_00174773;
    }
    bVar2 = cmsys::SystemTools::FileExists(local_398._M_dataplus._M_p);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a);
      __s._M_p = local_398._M_dataplus._M_p;
      goto LAB_00174773;
    }
    bVar2 = cmsys::SystemTools::FileExists(local_338._M_dataplus._M_p);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a);
      psVar5 = &local_338;
    }
    else {
      bVar2 = cmsys::SystemTools::FileExists(local_358._M_dataplus._M_p);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a
                  );
        psVar5 = &local_358;
      }
      else {
        bVar2 = cmsys::SystemTools::FileExists(local_378._M_dataplus._M_p);
        if (!bVar2) {
          iVar4 = 0;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"cmGeneratedFileStream works\n",0x1c);
          goto LAB_001747cf;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Something wrong with cmGeneratedFileStream. Temporary file is still here: ",0x4a
                  );
      }
    }
    poVar6 = std::operator<<((ostream *)&std::cout,(psVar5->_M_dataplus)._M_p);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Something wrong with cmGeneratedFileStream. Cannot find file: ",0x3e);
    __s._M_p = local_2b8._M_dataplus._M_p;
LAB_00174773:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__s._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      poVar6 = (ostream *)&std::cout;
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x9c2838);
    }
    else {
      sVar3 = strlen(__s._M_p);
      poVar6 = (ostream *)&std::cout;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s._M_p,sVar3);
    }
  }
  iVar4 = 1;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
LAB_001747cf:
  cmsys::SystemTools::RemoveFile(&local_2b8);
  cmsys::SystemTools::RemoveFile(&local_2d8);
  cmsys::SystemTools::RemoveFile(&local_2f8);
  cmsys::SystemTools::RemoveFile(&local_318);
  cmsys::SystemTools::RemoveFile(&local_398);
  cmsys::SystemTools::RemoveFile(&local_338);
  cmsys::SystemTools::RemoveFile(&local_358);
  cmsys::SystemTools::RemoveFile(&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_398._M_dataplus._M_p != &local_398.field_2) {
    operator_delete(local_398._M_dataplus._M_p,local_398.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_298);
  return iVar4;
}

Assistant:

int testGeneratedFileStream(int /*unused*/, char* /*unused*/ [])
{
  int failed = 0;
  cmGeneratedFileStream gm;
  std::string file1 = "generatedFile1";
  std::string file2 = "generatedFile2";
  std::string file3 = "generatedFile3";
  std::string file4 = "generatedFile4";
  std::string file1tmp = file1 + ".tmp";
  std::string file2tmp = file2 + ".tmp";
  std::string file3tmp = file3 + ".tmp";
  std::string file4tmp = file4 + ".tmp";
  gm.Open(file1.c_str());
  gm << "This is generated file 1";
  gm.Close();
  gm.Open(file2.c_str());
  gm << "This is generated file 2";
  gm.Close();
  gm.Open(file3.c_str());
  gm << "This is generated file 3";
  gm.Close();
  gm.Open(file4.c_str());
  gm << "This is generated file 4";
  gm.Close();
  if (cmSystemTools::FileExists(file1.c_str())) {
    if (cmSystemTools::FileExists(file2.c_str())) {
      if (cmSystemTools::FileExists(file3.c_str())) {
        if (cmSystemTools::FileExists(file4.c_str())) {
          if (cmSystemTools::FileExists(file1tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file1tmp.c_str());
          } else if (cmSystemTools::FileExists(file2tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file2tmp.c_str());
          } else if (cmSystemTools::FileExists(file3tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file3tmp.c_str());
          } else if (cmSystemTools::FileExists(file4tmp.c_str())) {
            cmFailed("Something wrong with cmGeneratedFileStream. Temporary "
                     "file is still here: ",
                     file4tmp.c_str());
          } else {
            std::cout << "cmGeneratedFileStream works\n";
          }
        } else {
          cmFailed(
            "Something wrong with cmGeneratedFileStream. Cannot find file: ",
            file4.c_str());
        }
      } else {
        cmFailed("Something wrong with cmGeneratedFileStream. Found file: ",
                 file3.c_str());
      }
    } else {
      cmFailed(
        "Something wrong with cmGeneratedFileStream. Cannot find file: ",
        file2.c_str());
    }
  } else {
    cmFailed("Something wrong with cmGeneratedFileStream. Cannot find file: ",
             file1.c_str());
  }
  cmSystemTools::RemoveFile(file1);
  cmSystemTools::RemoveFile(file2);
  cmSystemTools::RemoveFile(file3);
  cmSystemTools::RemoveFile(file4);
  cmSystemTools::RemoveFile(file1tmp);
  cmSystemTools::RemoveFile(file2tmp);
  cmSystemTools::RemoveFile(file3tmp);
  cmSystemTools::RemoveFile(file4tmp);

  return failed;
}